

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void unp::ErrorDoIt(int errnoFlag,int level,char *fmt,__va_list_tag *ap)

{
  int __errnum;
  int *piVar1;
  size_t sVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  char buf [4097];
  
  piVar1 = __errno_location();
  __errnum = *piVar1;
  vsnprintf(buf,0x1000,(char *)CONCAT44(in_register_00000034,level),fmt);
  if (errnoFlag != 0) {
    sVar2 = strlen(buf);
    pcVar3 = strerror(__errnum);
    snprintf(buf + (int)sVar2,(long)(0x1001 - (int)sVar2),": %s",pcVar3);
  }
  sVar2 = strlen(buf);
  (buf + sVar2)[0] = '\n';
  (buf + sVar2)[1] = '\0';
  if (daemonProc != 0) {
    vsyslog(3,buf,fmt);
    return;
  }
  fflush(_stdout);
  fputs(buf,_stderr);
  fflush(_stderr);
  return;
}

Assistant:

inline void unp::ErrorDoIt( int errnoFlag, int level, const char *fmt, va_list ap ) {
    int errnoSave, n;
    char buf[MAXLINE + 1];

    errnoSave = errno;
    std::vsnprintf( buf, MAXLINE, fmt, ap );     // don't make sense to still check if snprintf is available

    n = strlen( buf );
    // get error string if it related to system call error
    if ( errnoFlag ) {
        std::snprintf( buf + n, MAXLINE - n + 1, ": %s", strerror( errnoSave ) );
    }
    std::strncat( buf, "\n", 1 );

    if ( daemonProc ) {
        vsyslog( level, buf, ap );
    } else {
        std::fflush( stdout );
        std::fputs( buf, stderr );
        std::fflush( stderr );
    }
}